

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O2

CURLcode Curl_rand_alnum(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  undefined8 in_RAX;
  undefined8 uStack_38;
  uint r;
  
  uStack_38 = in_RAX;
  do {
    num = num - 1;
    if (num == 0) {
      *rnd = '\0';
      return CURLE_OK;
    }
    do {
      CVar1 = randit(data,&r);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    } while (0xfffffffb < r);
    *rnd = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"[(ulong)r % 0x3e];
    rnd = rnd + 1;
  } while( true );
}

Assistant:

CURLcode Curl_rand_alnum(struct Curl_easy *data, unsigned char *rnd,
                         size_t num)
{
  CURLcode result = CURLE_OK;
  const int alnumspace = sizeof(alnum) - 1;
  unsigned int r;
  DEBUGASSERT(num > 1);

  num--; /* save one for null-termination */

  while(num) {
    do {
      result = randit(data, &r);
      if(result)
        return result;
    } while(r >= (UINT_MAX - UINT_MAX % alnumspace));

    *rnd++ = alnum[r % alnumspace];
    num--;
  }
  *rnd = 0;

  return result;
}